

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::GatherEnumsTest::Run(GatherEnumsTest *this)

{
  int local_1c;
  GatherEnumsTest *pGStack_18;
  GLint res;
  GatherEnumsTest *this_local;
  
  pGStack_18 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8e5e,
             &local_1c);
  if (local_1c < -7) {
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x8e5f,
               &local_1c);
    if (local_1c < 7) {
      this_local = (GatherEnumsTest *)&DAT_ffffffffffffffff;
    }
    else {
      this_local = (GatherEnumsTest *)0x0;
    }
  }
  else {
    this_local = (GatherEnumsTest *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLint res;
		glGetIntegerv(GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET, &res);
		if (res > -8)
		{
			return ERROR;
		}
		glGetIntegerv(GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET, &res);
		if (res < 7)
		{
			return ERROR;
		}
		return NO_ERROR;
	}